

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

char * GetADSBEmitterCat(string *cat)

{
  char *pcVar1;
  byte bVar2;
  undefined *puVar3;
  
  pcVar1 = (cat->_M_dataplus)._M_p;
  if (cat->_M_string_length == 2) {
    switch(*pcVar1) {
    case 'A':
      bVar2 = pcVar1[1] - 0x30;
      if (bVar2 < 8) {
        puVar3 = &DAT_0023d158;
LAB_0016ed36:
        return puVar3 + *(int *)(puVar3 + (ulong)bVar2 * 4);
      }
      break;
    case 'B':
      bVar2 = pcVar1[1] - 0x30;
      if ((bVar2 < 8) && ((0xdfU >> (bVar2 & 0x1f) & 1) != 0)) {
        pcVar1 = &DAT_0023d178 + *(int *)(&DAT_0023d178 + (ulong)bVar2 * 4);
      }
      break;
    case 'C':
      bVar2 = pcVar1[1] - 0x30;
      if (bVar2 < 6) {
        puVar3 = &DAT_0023d198;
        goto LAB_0016ed36;
      }
      break;
    case 'D':
      if (pcVar1[1] == '0') {
        return "Category D - No Info";
      }
    }
  }
  return pcVar1;
}

Assistant:

const char* GetADSBEmitterCat (const std::string& cat)
{
    // We expect 2 characters
    if (cat.length() != 2) return cat.c_str();
    
    switch (cat[0]) {
        case 'A':
            switch (cat[1]) {
                case '0': return "Category A - No Info";
                case '1': return "Light (<15500 lbs)";
                case '2': return "Small (15500-75000 lbs)";
                case '3': return "Large (75000-300000 lbs)";
                case '4': return "High-Vortex Large";
                case '5': return "Heavy (>300000 lbs)";
                case '6': return "High Performance";
                case '7': return "Rotorcraft";
            }
            break;
        case 'B':
            switch (cat[1]) {
                case '0': return "Category B - No Info";
                case '1': return "Glider / Sailplane";
                case '2': return "Lighter-than-Air";
                case '3': return "Parachutist / Skydiver";
                case '4': return "Ultralight / hang-glider / paraglider";
                case '6': return "Unmanned Aerial Vehicle";
                case '7': return "Space / Trans-atmospheric vehicle";
            }
            break;
        case 'C':
            switch (cat[1]) {
                case '0': return "Category C - No Info";
                case '1': return "Emergency Vehicle";
                case '2': return "Service Vehicle";
                case '3': return "Point Obstacle";
                case '4': return "Cluster Obstacle";
                case '5': return "Line Obstacle";
            }
            break;
        case 'D':
            switch (cat[1]) {
                case '0': return "Category D - No Info";
            }
            break;
    }
    
    // Shouldn't be here...
    return cat.c_str();
}